

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

int like_at_loc(int for_match,char *file,int line,char *got,char *expected,char *fmt,...)

{
  char in_AL;
  int __errcode;
  uint uVar1;
  uint test;
  char *fmt_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  regex_t re;
  va_list args;
  regex_t local_228;
  undefined1 local_1e8 [48];
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  __va_list_tag local_138 [11];
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  __errcode = regcomp(&local_228,expected,1);
  if (__errcode == 0) {
    uVar1 = regexec(&local_228,got,0,(regmatch_t *)0x0,0);
    regfree(&local_228);
    test = (uint)(uVar1 == 0);
    if (for_match == 0) {
      test = uVar1;
    }
    local_138[0].reg_save_area = local_1e8;
    local_138[0].overflow_arg_area = &stack0x00000008;
    local_138[0].gp_offset = 0x30;
    local_138[0].fp_offset = 0x30;
    vok_at_loc(file,line,test,fmt,local_138);
    if (test == 0) {
      diag("                   \'%s\'",got);
      fmt_00 = "    doesn\'t match: \'%s\'";
      if (for_match == 0) {
        fmt_00 = "          matches: \'%s\'";
      }
      diag(fmt_00,expected);
    }
    return test;
  }
  regerror(__errcode,&local_228,(char *)local_138,0x100);
  fprintf(_stderr,"Unable to compile regex \'%s\': %s at %s line %d\n",expected,local_138,file,
          (ulong)(uint)line);
  exit(0xff);
}

Assistant:

int
like_at_loc (int for_match, const char *file, int line, const char *got,
             const char *expected, const char *fmt, ...)
{
    int test;
    regex_t re;
    va_list args;
    int err = regcomp(&re, expected, REG_EXTENDED);
    if (err) {
        char errbuf[256];
        regerror(err, &re, errbuf, sizeof errbuf);
        fprintf(stderr, "Unable to compile regex '%s': %s at %s line %d\n",
                        expected, errbuf, file, line);
        exit(255);
    }
    err = regexec(&re, got, 0, NULL, 0);
    regfree(&re);
    test = for_match ? !err : err;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        if (for_match) {
            diag("                   '%s'", got);
            diag("    doesn't match: '%s'", expected);
        }
        else {
            diag("                   '%s'", got);
            diag("          matches: '%s'", expected);
        }
    }
    return test;
}